

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_asn1.cc
# Opt level: O0

DSA * DSA_parse_public_key(CBS *cbs)

{
  bool bVar1;
  int iVar2;
  DSA *__p;
  pointer pdVar3;
  size_t sVar4;
  undefined1 local_38 [8];
  CBS child;
  unique_ptr<dsa_st,_bssl::internal::Deleter> local_20;
  UniquePtr<DSA> ret;
  CBS *cbs_local;
  
  ret._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_dsa_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<dsa_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_data<dsa_st,_bssl::internal::Deleter,_true,_true>)cbs;
  __p = DSA_new();
  std::unique_ptr<dsa_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<dsa_st,bssl::internal::Deleter> *)&local_20,(pointer)__p);
  bVar1 = std::operator==(&local_20,(nullptr_t)0x0);
  if (bVar1) {
    cbs_local = (CBS *)0x0;
  }
  else {
    iVar2 = CBS_get_asn1((CBS *)ret._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t
                                .super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl,(CBS *)local_38,
                         0x20000010);
    if (iVar2 != 0) {
      pdVar3 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::operator->(&local_20);
      iVar2 = parse_integer((CBS *)local_38,&pdVar3->pub_key);
      if (iVar2 != 0) {
        pdVar3 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::operator->(&local_20);
        iVar2 = parse_integer((CBS *)local_38,&pdVar3->p);
        if (iVar2 != 0) {
          pdVar3 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::operator->(&local_20);
          iVar2 = parse_integer((CBS *)local_38,&pdVar3->q);
          if (iVar2 != 0) {
            pdVar3 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::operator->(&local_20);
            iVar2 = parse_integer((CBS *)local_38,&pdVar3->g);
            if (iVar2 != 0) {
              sVar4 = CBS_len((CBS *)local_38);
              if (sVar4 == 0) {
                pdVar3 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::get(&local_20);
                iVar2 = dsa_check_key(pdVar3);
                if (iVar2 == 0) {
                  cbs_local = (CBS *)0x0;
                }
                else {
                  cbs_local = (CBS *)std::unique_ptr<dsa_st,_bssl::internal::Deleter>::release
                                               (&local_20);
                }
                goto LAB_00256bcc;
              }
            }
          }
        }
      }
    }
    ERR_put_error(10,0,0x69,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa_asn1.cc"
                  ,0x96);
    cbs_local = (CBS *)0x0;
  }
LAB_00256bcc:
  child.len._4_4_ = 1;
  std::unique_ptr<dsa_st,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  return (DSA *)cbs_local;
}

Assistant:

DSA *DSA_parse_public_key(CBS *cbs) {
  bssl::UniquePtr<DSA> ret(DSA_new());
  if (ret == nullptr) {
    return nullptr;
  }
  CBS child;
  if (!CBS_get_asn1(cbs, &child, CBS_ASN1_SEQUENCE) ||
      !parse_integer(&child, &ret->pub_key) ||
      !parse_integer(&child, &ret->p) ||
      !parse_integer(&child, &ret->q) ||
      !parse_integer(&child, &ret->g) ||
      CBS_len(&child) != 0) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_DECODE_ERROR);
    return nullptr;
  }
  if (!dsa_check_key(ret.get())) {
    return nullptr;
  }
  return ret.release();
}